

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

uint rlLoadShaderProgram(uint vShaderId,uint fShaderId)

{
  GLchar *__ptr;
  char *log;
  int length;
  int maxLength;
  GLint success;
  uint program;
  uint fShaderId_local;
  uint vShaderId_local;
  
  maxLength = 0;
  length = 0;
  success = fShaderId;
  program = vShaderId;
  maxLength = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(maxLength,program);
  (*glad_glAttachShader)(maxLength,success);
  (*glad_glBindAttribLocation)(maxLength,0,"vertexPosition");
  (*glad_glBindAttribLocation)(maxLength,1,"vertexTexCoord");
  (*glad_glBindAttribLocation)(maxLength,2,"vertexNormal");
  (*glad_glBindAttribLocation)(maxLength,3,"vertexColor");
  (*glad_glBindAttribLocation)(maxLength,4,"vertexTangent");
  (*glad_glBindAttribLocation)(maxLength,5,"vertexTexCoord2");
  (*glad_glLinkProgram)(maxLength);
  (*glad_glGetProgramiv)(maxLength,0x8b82,&length);
  if (length == 0) {
    TraceLog(4,"SHADER: [ID %i] Failed to link shader program",(ulong)(uint)maxLength);
    log._4_4_ = 0;
    (*glad_glGetProgramiv)(maxLength,0x8b84,(GLint *)((long)&log + 4));
    if (0 < log._4_4_) {
      log._0_4_ = 0;
      __ptr = (GLchar *)calloc((long)log._4_4_,1);
      (*glad_glGetProgramInfoLog)(maxLength,log._4_4_,(GLsizei *)&log,__ptr);
      TraceLog(4,"SHADER: [ID %i] Link error: %s",(ulong)(uint)maxLength,__ptr);
      free(__ptr);
    }
    (*glad_glDeleteProgram)(maxLength);
    maxLength = 0;
  }
  else {
    TraceLog(3,"SHADER: [ID %i] Program shader loaded successfully",(ulong)(uint)maxLength);
  }
  return maxLength;
}

Assistant:

unsigned int rlLoadShaderProgram(unsigned int vShaderId, unsigned int fShaderId)
{
    unsigned int program = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    GLint success = 0;
    program = glCreateProgram();

    glAttachShader(program, vShaderId);
    glAttachShader(program, fShaderId);

    // NOTE: Default attribute shader locations must be binded before linking
    glBindAttribLocation(program, 0, DEFAULT_SHADER_ATTRIB_NAME_POSITION);
    glBindAttribLocation(program, 1, DEFAULT_SHADER_ATTRIB_NAME_TEXCOORD);
    glBindAttribLocation(program, 2, DEFAULT_SHADER_ATTRIB_NAME_NORMAL);
    glBindAttribLocation(program, 3, DEFAULT_SHADER_ATTRIB_NAME_COLOR);
    glBindAttribLocation(program, 4, DEFAULT_SHADER_ATTRIB_NAME_TANGENT);
    glBindAttribLocation(program, 5, DEFAULT_SHADER_ATTRIB_NAME_TEXCOORD2);

    // NOTE: If some attrib name is no found on the shader, it locations becomes -1

    glLinkProgram(program);

    // NOTE: All uniform variables are intitialised to 0 when a program links

    glGetProgramiv(program, GL_LINK_STATUS, &success);

    if (success == GL_FALSE)
    {
        TRACELOG(LOG_WARNING, "SHADER: [ID %i] Failed to link shader program", program);

        int maxLength = 0;
        glGetProgramiv(program, GL_INFO_LOG_LENGTH, &maxLength);

        if (maxLength > 0)
        {
            int length = 0;
            char *log = RL_CALLOC(maxLength, sizeof(char));
            glGetProgramInfoLog(program, maxLength, &length, log);
            TRACELOG(LOG_WARNING, "SHADER: [ID %i] Link error: %s", program, log);
            RL_FREE(log);
        }

        glDeleteProgram(program);

        program = 0;
    }
    else TRACELOG(LOG_INFO, "SHADER: [ID %i] Program shader loaded successfully", program);
#endif
    return program;
}